

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *originalPtr,size_t originalSize,
          size_t newSize)

{
  ulong __n;
  ulong size;
  void *newBuffer;
  size_t increment;
  size_t newSize_local;
  size_t originalSize_local;
  void *originalPtr_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  if (originalPtr == (void *)0x0) {
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)Malloc(this,newSize);
  }
  else if (newSize == 0) {
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  }
  else {
    __n = originalSize + 7 & 0xfffffffffffffff8;
    size = newSize + 7 & 0xfffffffffffffff8;
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)originalPtr;
    if (__n < size) {
      if ((originalPtr == (void *)((long)this->chunkHead_ + ((this->chunkHead_->size + 0x18) - __n))
          ) && (this->chunkHead_->size + (size - __n) <= this->chunkHead_->capacity)) {
        this->chunkHead_->size = (size - __n) + this->chunkHead_->size;
      }
      else {
        this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)Malloc(this,size);
        if (this_local == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
          this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
        }
        else if (__n != 0) {
          memcpy(this_local,originalPtr,__n);
        }
      }
    }
  }
  return this_local;
}

Assistant:

void* Realloc(void* originalPtr, size_t originalSize, size_t newSize) {
        if (originalPtr == 0)
            return Malloc(newSize);

        if (newSize == 0)
            return NULL;

        originalSize = RAPIDJSON_ALIGN(originalSize);
        newSize = RAPIDJSON_ALIGN(newSize);

        // Do not shrink if new size is smaller than original
        if (originalSize >= newSize)
            return originalPtr;

        // Simply expand it if it is the last allocation and there is sufficient space
        if (originalPtr == reinterpret_cast<char *>(chunkHead_) + RAPIDJSON_ALIGN(sizeof(ChunkHeader)) + chunkHead_->size - originalSize) {
            size_t increment = static_cast<size_t>(newSize - originalSize);
            if (chunkHead_->size + increment <= chunkHead_->capacity) {
                chunkHead_->size += increment;
                return originalPtr;
            }
        }

        // Realloc process: allocate and copy memory, do not free original buffer.
        if (void* newBuffer = Malloc(newSize)) {
            if (originalSize)
                std::memcpy(newBuffer, originalPtr, originalSize);
            return newBuffer;
        }
        else
            return NULL;
    }